

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  ostream *this_00;
  int local_5c;
  string local_58 [4];
  int dist;
  string enemy;
  int local_38;
  int local_34;
  int i;
  int min;
  string answer;
  int local_10 [2];
  int count;
  
  local_10[1] = 0;
  do {
    std::istream::operator>>((istream *)&std::cin,local_10);
    std::istream::ignore();
    std::__cxx11::string::string((string *)&i);
    local_34 = 0x18894;
    for (local_38 = 0; local_38 < local_10[0]; local_38 = local_38 + 1) {
      std::__cxx11::string::string(local_58);
      this = std::operator>>((istream *)&std::cin,local_58);
      std::istream::operator>>(this,&local_5c);
      std::istream::ignore();
      if (local_5c < local_34) {
        local_34 = local_5c;
        std::__cxx11::string::operator=((string *)&i,local_58);
      }
      std::__cxx11::string::~string(local_58);
    }
    this_00 = std::operator<<((ostream *)&std::cout,(string *)&i);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&i);
  } while( true );
}

Assistant:

int main()
{

    // game loop
    while (1) {
        int count; // The number of current enemy ships within range
        cin >> count; cin.ignore();
        std::string answer;
        int min = 100500;
        for (int i = 0; i < count; i++)
        {
            string enemy; // The name of this enemy
            int dist; // The distance to your cannon of this enemy
            cin >> enemy >> dist; cin.ignore();
            if (min > dist)
            {
                min = dist;
                answer = enemy;
            }
        }

        // Write an action using cout. DON'T FORGET THE "<< endl"
        // To debug: cerr << "Debug messages..." << endl;

        cout << answer << endl; // The name of the most threatening enemy (HotDroid is just one example)
    }
}